

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbitarray.cpp
# Opt level: O3

QBitArray * __thiscall
QBitArray::inverted_inplace(QBitArray *__return_storage_ptr__,QBitArray *this)

{
  char cVar1;
  char *pcVar2;
  ulong capacity;
  Data *pDVar3;
  char *pcVar4;
  ulong uVar5;
  char *__old_val;
  long in_FS_OFFSET;
  QArrayData *d;
  QArrayData *local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pcVar2 = (this->d).d.ptr;
  capacity = (this->d).d.size;
  (__return_storage_ptr__->d).d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).d.ptr = &DAT_aaaaaaaaaaaaaaaa;
  pDVar3 = (this->d).d.d;
  if (pDVar3 == (Data *)0x0) {
    if (capacity == 0) goto LAB_00353883;
LAB_00353856:
    local_30 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
    pcVar4 = (char *)QArrayData::allocate1(&local_30,capacity,KeepSize);
    (__return_storage_ptr__->d).d.d = (Data *)local_30;
    (__return_storage_ptr__->d).d.ptr = pcVar4;
    (__return_storage_ptr__->d).d.size = capacity;
  }
  else {
    if ((capacity != 0) &&
       ((__int_type_conflict)(pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int> != 1)
       ) goto LAB_00353856;
LAB_00353883:
    (this->d).d.d = (Data *)0x0;
    (this->d).d.ptr = (char *)0x0;
    (this->d).d.size = 0;
    (__return_storage_ptr__->d).d.d = pDVar3;
    (__return_storage_ptr__->d).d.ptr = pcVar2;
    (__return_storage_ptr__->d).d.size = capacity;
    pcVar4 = pcVar2;
    if (capacity == 0) goto LAB_003538e3;
  }
  cVar1 = *pcVar2;
  *pcVar4 = cVar1;
  if (1 < capacity) {
    uVar5 = 1;
    do {
      pcVar4[uVar5] = ~pcVar2[uVar5];
      uVar5 = uVar5 + 1;
    } while (capacity != uVar5);
  }
  if (cVar1 != '\b') {
    pcVar4[capacity - 1] = pcVar4[capacity - 1] & ~(byte)(-1 << (0x10U - cVar1 & 0x1f));
  }
LAB_003538e3:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

Q_NEVER_INLINE QBitArray QBitArray::inverted_inplace() &&
{
    qsizetype n = d.size();
    uchar *dst = reinterpret_cast<uchar *>(data_ptr().data());
    const uchar *src = dst;
    QBitArray result([&] {
        if (d.isDetached() || n == 0)
            return std::move(d.data_ptr());     // invert in-place

        QByteArrayData tmp(n, n);
        dst = reinterpret_cast<uchar *>(tmp.data());
        return tmp;
    }());

    uchar bitdiff = 8;
    if (n)
        bitdiff = dst[0] = src[0];      // copy the count of bits in the last byte

    for (qsizetype i = 1; i < n; ++i)
        dst[i] = ~src[i];

    if (int tailCount = 16 - bitdiff; tailCount != 8) {
        // zero the bits beyond our size in the last byte
        Q_ASSERT(n > 1);
        uchar tailMask = (1U << tailCount) - 1;
        dst[n - 1] &= tailMask;
    }

    return result;
}